

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

uint32_t __thiscall Confparse::ParseHex(Confparse *this,char *key,uint32_t defaultv)

{
  ulong uVar1;
  int *piVar2;
  uint32_t in_EDX;
  char *unaff_retaddr;
  Confparse *in_stack_00000008;
  uint32_t v;
  char *p;
  char *local_28;
  uint32_t local_4;
  
  local_28 = Parse(in_stack_00000008,unaff_retaddr);
  local_4 = in_EDX;
  if (local_28 != (char *)0x0) {
    if ((*local_28 == '0') && (local_28[1] == 'x')) {
      local_28 = local_28 + 2;
    }
    uVar1 = strtoul(local_28,(char **)0x0,0x10);
    local_4 = (uint32_t)uVar1;
    piVar2 = __errno_location();
    if (*piVar2 == 0x22) {
      local_4 = in_EDX;
    }
  }
  return local_4;
}

Assistant:

uint32_t Confparse::ParseHex(const char *key, uint32_t defaultv) {
	char *p = Parse(key);
	if (p) {
		uint32_t v;
		if ((*p == '0') && (*(p + 1) == 'x')) {
			p += 2;
		}
		v = strtoul(p, NULL, 16);
		if (errno == ERANGE)
			return defaultv;
		else
			return v;
	} else
		return defaultv;
}